

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O0

void __thiscall Transporter::StartEventLoop(Transporter *this)

{
  Transporter *local_48;
  code *local_40;
  undefined8 local_38;
  type local_30;
  thread local_18;
  Transporter *local_10;
  Transporter *this_local;
  
  local_40 = Run;
  local_38 = 0;
  local_48 = this;
  local_10 = this;
  std::bind<void(Transporter::*)(),Transporter*>
            (&local_30,(offset_in_Transporter_to_subr *)&local_40,&local_48);
  std::thread::thread<std::_Bind<void(Transporter::*(Transporter*))()>,,void>(&local_18,&local_30);
  std::thread::operator=(&this->thread,&local_18);
  std::thread::~thread(&local_18);
  return;
}

Assistant:

void Transporter::StartEventLoop()
{
	thread = std::thread(std::bind(&Transporter::Run, this));
}